

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

QString * __thiscall
QJsonValueConstRef::concreteString
          (QString *__return_storage_ptr__,QJsonValueConstRef *this,QJsonValueConstRef self,
          QString *defaultValue)

{
  Data *pDVar1;
  long *plVar2;
  ulong idx;
  
  plVar2 = self._8_8_;
  idx = (ulong)self.field_0.a >> (~self.field_0._0_1_ & 1);
  if ((((QCborContainerPrivate *)(this->field_0).a)->elements).d.ptr[idx].type == String) {
    QCborContainerPrivate::stringAt
              (__return_storage_ptr__,(QCborContainerPrivate *)(this->field_0).a,idx);
  }
  else {
    pDVar1 = (Data *)*plVar2;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (char16_t *)plVar2[1];
    (__return_storage_ptr__->d).size = plVar2[2];
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QJsonValueConstRef::concreteString(QJsonValueConstRef self, const QString &defaultValue)
{
    const QCborContainerPrivate *d = QJsonPrivate::Value::container(self);
    qsizetype index = QJsonPrivate::Value::indexHelper(self);
    if (d->elements.at(index).type != QCborValue::String)
        return defaultValue;
    return d->stringAt(index);
}